

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O3

void __thiscall
aeron::Image::Image(Image *this,int32_t sessionId,int64_t correlationId,
                   int64_t subscriptionRegistrationId,string *sourceIdentity,
                   UnsafeBufferPosition *subscriberPosition,
                   shared_ptr<aeron::LogBuffers> *logBuffers,exception_handler_t *exceptionHandler)

{
  length_t *plVar1;
  int32_t iVar2;
  uint uVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer pcVar6;
  int64_t iVar7;
  int iVar8;
  long lVar9;
  
  this->_vptr_Image = (_func_int **)&PTR__Image_001637f0;
  lVar9 = 0x18;
  do {
    *(undefined ***)((long)((this->m_termBuffers)._M_elems + -1) + lVar9) =
         &PTR__AtomicBuffer_00163200;
    *(undefined8 *)((long)(this->m_termBuffers)._M_elems + lVar9 + -0x10) = 0;
    *(undefined4 *)((long)(this->m_termBuffers)._M_elems + lVar9 + -8) = 0;
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x60);
  peVar4 = (logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar2 = *(int32_t *)(peVar4->m_buffers[3].m_buffer + 0x108);
  plVar1 = &peVar4->m_buffers[0].m_length;
  iVar8 = 0;
  if (*plVar1 != 0) {
    for (; (*plVar1 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
    }
  }
  (this->m_header).m_context = this;
  (this->m_header).m_buffer._vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_00163200;
  (this->m_header).m_buffer.m_buffer = (uint8_t *)0x0;
  (this->m_header).m_buffer.m_length = 0;
  (this->m_header).m_offset = 0;
  (this->m_header).m_initialTermId = iVar2;
  (this->m_header).m_positionBitsToShift = iVar8;
  (this->m_subscriberPosition).
  super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_buffer.
  _vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_00163200;
  (this->m_subscriberPosition).
  super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_buffer.m_buffer =
       (uint8_t *)0x0;
  (this->m_subscriberPosition).
  super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_buffer.m_length =
       0;
  (this->m_subscriberPosition).
  super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_buffer.m_buffer =
       (subscriberPosition->m_buffer).m_buffer;
  (this->m_subscriberPosition).
  super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_buffer.m_length =
       (subscriberPosition->m_buffer).m_length;
  iVar2 = subscriberPosition->m_offset;
  (this->m_subscriberPosition).
  super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_id =
       subscriberPosition->m_id;
  (this->m_subscriberPosition).
  super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_offset = iVar2;
  (this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar4;
  p_Var5 = (logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var5;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  (this->m_sourceIdentity)._M_dataplus._M_p = (pointer)&(this->m_sourceIdentity).field_2;
  pcVar6 = (sourceIdentity->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_sourceIdentity,pcVar6,pcVar6 + sourceIdentity->_M_string_length);
  (this->m_isClosed)._M_base._M_i = false;
  std::function<void_(const_std::exception_&)>::function(&this->m_exceptionHandler,exceptionHandler)
  ;
  this->m_correlationId = correlationId;
  this->m_subscriptionRegistrationId = subscriptionRegistrationId;
  this->m_sessionId = sessionId;
  lVar9 = 0;
  do {
    peVar4 = (logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    *(undefined4 *)((long)&(this->m_termBuffers)._M_elems[0].m_length + lVar9) =
         *(undefined4 *)((long)&peVar4->m_buffers[0].m_length + lVar9);
    *(undefined8 *)((long)&(this->m_termBuffers)._M_elems[0].m_buffer + lVar9) =
         *(undefined8 *)((long)&peVar4->m_buffers[0].m_buffer + lVar9);
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x48);
  uVar3 = (this->m_termBuffers)._M_elems[0].m_length;
  iVar7 = *(int64_t *)((subscriberPosition->m_buffer).m_buffer + subscriberPosition->m_offset);
  this->m_joinPosition = iVar7;
  this->m_finalPosition = iVar7;
  this->m_termLengthMask = uVar3 - 1;
  iVar8 = 0;
  if (uVar3 != 0) {
    for (; (uVar3 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
    }
  }
  this->m_positionBitsToShift = iVar8;
  this->m_isEos = false;
  return;
}

Assistant:

Image(
        std::int32_t sessionId,
        std::int64_t correlationId,
        std::int64_t subscriptionRegistrationId,
        const std::string& sourceIdentity,
        UnsafeBufferPosition& subscriberPosition,
        std::shared_ptr<LogBuffers> logBuffers,
        const exception_handler_t& exceptionHandler) :
        m_header(
            LogBufferDescriptor::initialTermId(logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX)),
            logBuffers->atomicBuffer(0).capacity(),
            this),
        m_subscriberPosition(subscriberPosition),
        m_logBuffers(logBuffers),
        m_sourceIdentity(sourceIdentity),
        m_isClosed(false),
        m_exceptionHandler(exceptionHandler),
        m_correlationId(correlationId),
        m_subscriptionRegistrationId(subscriptionRegistrationId),
        m_sessionId(sessionId)
    {
        for (int i = 0; i < LogBufferDescriptor::PARTITION_COUNT; i++)
        {
            m_termBuffers[i] = logBuffers->atomicBuffer(i);
        }

        const util::index_t capacity = m_termBuffers[0].capacity();

        m_joinPosition = subscriberPosition.get();
        m_finalPosition = m_joinPosition;
        m_termLengthMask = capacity - 1;
        m_positionBitsToShift = BitUtil::numberOfTrailingZeroes(capacity);
        m_isEos = false;
    }